

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionFunctions.cpp
# Opt level: O0

bool getExpFuncParameter(vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters,
                        size_t index,StringLiteral **dest,Identifier *funcName,bool optional)

{
  StringLiteral **ppSVar1;
  bool bVar2;
  size_type sVar3;
  StringLiteral **ppSVar4;
  const_reference pvVar5;
  unsigned_long local_40;
  undefined1 local_31;
  Identifier *pIStack_30;
  bool optional_local;
  Identifier *funcName_local;
  StringLiteral **dest_local;
  size_t index_local;
  vector<ExpressionValue,_std::allocator<ExpressionValue>_> *parameters_local;
  
  local_31 = optional;
  pIStack_30 = funcName;
  funcName_local = (Identifier *)dest;
  dest_local = (StringLiteral **)index;
  index_local = (size_t)parameters;
  if ((optional) &&
     (sVar3 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::size(parameters),
     sVar3 <= index)) {
    return true;
  }
  ppSVar1 = dest_local;
  ppSVar4 = (StringLiteral **)
            std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::size
                      ((vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)index_local);
  if (ppSVar1 < ppSVar4) {
    pvVar5 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[]
                       ((vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)index_local,
                        (size_type)dest_local);
    bVar2 = ExpressionValue::isString(pvVar5);
    if (bVar2) {
      pvVar5 = std::vector<ExpressionValue,_std::allocator<ExpressionValue>_>::operator[]
                         ((vector<ExpressionValue,_std::allocator<ExpressionValue>_> *)index_local,
                          (size_type)dest_local);
      *(StringLiteral **)&funcName_local->_name = &pvVar5->strValue;
      return true;
    }
  }
  local_40 = (long)dest_local + 1;
  Logger::queueError<unsigned_long,Identifier>
            (Error,"Invalid parameter %d for %s: expecting string",&local_40,pIStack_30);
  return false;
}

Assistant:

bool getExpFuncParameter(const std::vector<ExpressionValue>& parameters, size_t index, const StringLiteral*& dest,
	const Identifier &funcName, bool optional)
{
	if (optional && index >= parameters.size())
		return true;

	if (index >= parameters.size() || !parameters[index].isString())
	{
		Logger::queueError(Logger::Error, "Invalid parameter %d for %s: expecting string",index+1,funcName);
		return false;
	}

	dest = &parameters[index].strValue;
	return true;
}